

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str,StringRef *matcherString)

{
  StringMatcherBase local_90;
  
  Matchers::Equals((EqualsMatcher *)&local_90,str,Yes);
  handleExceptionMatchExpr
            (handler,&local_90.
                      super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,matcherString);
  Matchers::StdString::StringMatcherBase::~StringMatcherBase(&local_90);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str, StringRef const& matcherString  ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ), matcherString );
    }